

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

void PrepareMapToPalette(uint32_t *palette,uint32_t num_colors,uint32_t *sorted,uint32_t *idx_map)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ulong __nmemb;
  bool bVar9;
  
  __nmemb = (ulong)num_colors;
  memcpy(sorted,palette,__nmemb * 4);
  qsort(sorted,__nmemb,4,PaletteCompareColorsForQsort);
  if (num_colors != 0) {
    uVar3 = 0;
    do {
      uVar1 = palette[uVar3];
      if (*sorted == uVar1) {
        lVar4 = 0;
      }
      else {
        uVar6 = 0;
        uVar5 = num_colors;
        do {
          uVar7 = (int)(uVar5 + uVar6) >> 1;
          uVar2 = sorted[(int)uVar7];
          bVar9 = uVar2 == uVar1;
          uVar8 = uVar6;
          if (uVar2 < uVar1) {
            uVar8 = uVar7;
          }
          if (bVar9) {
            uVar8 = uVar6;
          }
          uVar6 = uVar8;
          if (uVar2 >= uVar1 && !bVar9) {
            uVar5 = uVar7;
          }
        } while (!bVar9);
        lVar4 = (long)(int)uVar7;
      }
      idx_map[lVar4] = (uint32_t)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar3 != __nmemb);
  }
  return;
}

Assistant:

void PrepareMapToPalette(const uint32_t palette[], uint32_t num_colors,
                         uint32_t sorted[], uint32_t idx_map[]) {
  uint32_t i;
  memcpy(sorted, palette, num_colors * sizeof(*sorted));
  qsort(sorted, num_colors, sizeof(*sorted), PaletteCompareColorsForQsort);
  for (i = 0; i < num_colors; ++i) {
    idx_map[SearchColorNoIdx(sorted, palette[i], num_colors)] = i;
  }
}